

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O1

void __thiscall QGraphicsViewPrivate::recalculateContentSize(QGraphicsViewPrivate *this)

{
  double dVar1;
  ScrollBarPolicy SVar2;
  QWidget *this_00;
  QRegionData *pQVar3;
  bool bVar4;
  bool bVar5;
  qreal qVar6;
  qreal qVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  LayoutDirection LVar11;
  QSize QVar12;
  QStyle *pQVar13;
  int iVar14;
  Representation RVar15;
  int min;
  Representation RVar16;
  Representation RVar17;
  Representation RVar18;
  long in_FS_OFFSET;
  bool bVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  QRectF local_78;
  QRectF local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)
             &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.
              field_0x8;
  QVar12 = QAbstractScrollArea::maximumViewportSize((QAbstractScrollArea *)this_00);
  local_58.w._0_4_ = 0xffffffff;
  local_58.w._4_4_ = 0xffffffff;
  local_58.h._0_4_ = 0xffffffff;
  local_58.h._4_4_ = 0xffffffff;
  local_58.xp._0_4_ = 0xffffffff;
  local_58.xp._4_4_ = 0xffffffff;
  local_58.yp._0_4_ = 0xffffffff;
  local_58.yp._4_4_ = 0xffffffff;
  QGraphicsView::sceneRect(&local_78,(QGraphicsView *)this_00);
  QTransform::mapRect(&local_58);
  pQVar13 = QWidget::style(this_00);
  iVar8 = (**(code **)(*(long *)pQVar13 + 0xf0))(pQVar13,0x11,0,this_00,0);
  RVar17 = QVar12.ht.m_i;
  RVar16 = QVar12.wd.m_i;
  RVar15.m_i = RVar16.m_i;
  RVar18.m_i = RVar17.m_i;
  if (iVar8 != 0) {
    iVar14 = (this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.frameWidth * 2;
    iVar9 = 0;
    if ((this->super_QAbstractScrollAreaPrivate).hbarpolicy == ScrollBarAlwaysOn) {
      iVar9 = iVar14;
    }
    RVar18.m_i = RVar17.m_i - iVar9;
    if ((this->super_QAbstractScrollAreaPrivate).vbarpolicy != ScrollBarAlwaysOn) {
      iVar14 = 0;
    }
    RVar15.m_i = RVar16.m_i - iVar14;
  }
  pQVar13 = QWidget::style(this_00);
  iVar9 = (**(code **)(*(long *)pQVar13 + 0xe0))(pQVar13,9,0,this_00);
  iVar14 = (this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.frameWidth * 2;
  if (iVar8 == 0) {
    iVar14 = 0;
  }
  iVar14 = iVar14 + iVar9;
  dVar21 = (double)CONCAT44(local_58.w._4_4_,local_58.w._0_4_);
  SVar2 = (this->super_QAbstractScrollAreaPrivate).hbarpolicy;
  bVar4 = SVar2 == ScrollBarAsNeeded && (double)RVar15.m_i < dVar21;
  bVar19 = (this->super_QAbstractScrollAreaPrivate).vbarpolicy == ScrollBarAsNeeded;
  bVar5 = (double)RVar18.m_i < (double)CONCAT44(local_58.h._4_4_,local_58.h._0_4_) && bVar19;
  if ((bVar19 && (SVar2 == ScrollBarAsNeeded && (double)RVar15.m_i < dVar21)) &&
     ((double)(RVar18.m_i - iVar14) < (double)CONCAT44(local_58.h._4_4_,local_58.h._0_4_))) {
    bVar5 = true;
  }
  if (((bool)(SVar2 == ScrollBarAsNeeded & bVar5)) && ((double)(RVar15.m_i - iVar14) < dVar21)) {
    bVar4 = true;
  }
  iVar8 = 0;
  if (bVar4) {
    iVar8 = iVar14;
  }
  iVar9 = 0;
  if (bVar5) {
    iVar9 = iVar14;
  }
  iVar9 = RVar15.m_i - iVar9;
  dVar20 = (double)CONCAT44(local_58.xp._4_4_,local_58.xp._0_4_);
  iVar14 = -0x80000000;
  min = -0x80000000;
  if ((-2147483648.0 < dVar20) && (min = 0x7fffffff, dVar20 < 2147483647.0)) {
    if (0.0 <= dVar20) {
      min = (int)(dVar20 + 0.5);
    }
    else {
      min = (int)((dVar20 - (double)(int)(dVar20 + -1.0)) + 0.5) + (int)(dVar20 + -1.0);
    }
  }
  dVar22 = (dVar21 + dVar20) - (double)iVar9;
  if ((-2147483648.0 < dVar22) && (iVar14 = 0x7fffffff, dVar22 < 2147483647.0)) {
    if (0.0 <= dVar22) {
      iVar14 = (int)(dVar22 + 0.5);
    }
    else {
      iVar14 = (int)((dVar22 - (double)(int)(dVar22 + -1.0)) + 0.5) + (int)(dVar22 + -1.0);
    }
  }
  qVar6 = (this->lastCenterPoint).xp;
  qVar7 = (this->lastCenterPoint).yp;
  dVar22 = this->leftIndent;
  dVar1 = this->topIndent;
  if (min < iVar14) {
    this->leftIndent = 0.0;
    QAbstractSlider::setRange
              (&((this->super_QAbstractScrollAreaPrivate).hbar)->super_QAbstractSlider,min,iVar14);
    QAbstractSlider::setPageStep
              (&((this->super_QAbstractScrollAreaPrivate).hbar)->super_QAbstractSlider,iVar9);
    QAbstractSlider::setSingleStep
              (&((this->super_QAbstractScrollAreaPrivate).hbar)->super_QAbstractSlider,iVar9 / 0x14)
    ;
    if ((dVar22 != 0.0) || (NAN(dVar22))) {
      QAbstractSlider::setValue
                (&((this->super_QAbstractScrollAreaPrivate).hbar)->super_QAbstractSlider,
                 (int)-dVar22);
    }
  }
  else {
    uVar10 = (this->alignment).super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
             super_QFlagsStorage<Qt::AlignmentFlag>.i & 0x1f;
    if (uVar10 == 2) {
      dVar20 = (((double)RVar16.m_i - dVar21) - dVar20) + -1.0;
    }
    else if (uVar10 == 1) {
      dVar20 = -dVar20;
    }
    else {
      dVar20 = (dVar20 + dVar21 + dVar20) * -0.5 +
               (double)((int)(((uint)((ulong)QVar12 >> 0x1f) & 1) + RVar16.m_i) >> 1);
    }
    this->leftIndent = dVar20;
    QAbstractSlider::setRange
              (&((this->super_QAbstractScrollAreaPrivate).hbar)->super_QAbstractSlider,0,0);
  }
  iVar8 = RVar18.m_i - iVar8;
  dVar21 = (double)CONCAT44(local_58.yp._4_4_,local_58.yp._0_4_);
  iVar14 = -0x80000000;
  iVar9 = -0x80000000;
  if ((-2147483648.0 < dVar21) && (iVar9 = 0x7fffffff, dVar21 < 2147483647.0)) {
    if (0.0 <= dVar21) {
      iVar9 = (int)(dVar21 + 0.5);
    }
    else {
      iVar9 = (int)((dVar21 - (double)(int)(dVar21 + -1.0)) + 0.5) + (int)(dVar21 + -1.0);
    }
  }
  dVar20 = dVar21 + (double)CONCAT44(local_58.h._4_4_,local_58.h._0_4_);
  dVar23 = dVar20 - (double)iVar8;
  if ((-2147483648.0 < dVar23) && (iVar14 = 0x7fffffff, dVar23 < 2147483647.0)) {
    if (0.0 <= dVar23) {
      iVar14 = (int)(dVar23 + 0.5);
    }
    else {
      iVar14 = (int)((dVar23 - (double)(int)(dVar23 + -1.0)) + 0.5) + (int)(dVar23 + -1.0);
    }
  }
  if (iVar9 < iVar14) {
    this->topIndent = 0.0;
    QAbstractSlider::setRange
              (&((this->super_QAbstractScrollAreaPrivate).vbar)->super_QAbstractSlider,iVar9,iVar14)
    ;
    QAbstractSlider::setPageStep
              (&((this->super_QAbstractScrollAreaPrivate).vbar)->super_QAbstractSlider,iVar8);
    QAbstractSlider::setSingleStep
              (&((this->super_QAbstractScrollAreaPrivate).vbar)->super_QAbstractSlider,iVar8 / 0x14)
    ;
    if ((dVar1 != 0.0) || (NAN(dVar1))) {
      QAbstractSlider::setValue
                (&((this->super_QAbstractScrollAreaPrivate).vbar)->super_QAbstractSlider,(int)-dVar1
                );
    }
  }
  else {
    uVar10 = (this->alignment).super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
             super_QFlagsStorage<Qt::AlignmentFlag>.i & 0x1e0;
    if (uVar10 == 0x40) {
      dVar21 = (((double)RVar17.m_i - (double)CONCAT44(local_58.h._4_4_,local_58.h._0_4_)) - dVar21)
               + -1.0;
    }
    else if (uVar10 == 0x20) {
      dVar21 = -dVar21;
    }
    else {
      dVar21 = (dVar21 + dVar20) * -0.5 + (double)(RVar17.m_i / 2);
    }
    this->topIndent = dVar21;
    QAbstractSlider::setRange
              (&((this->super_QAbstractScrollAreaPrivate).vbar)->super_QAbstractSlider,0,0);
  }
  (this->lastCenterPoint).xp = qVar6;
  (this->lastCenterPoint).yp = qVar7;
  if ((((dVar22 != this->leftIndent) || (NAN(dVar22) || NAN(this->leftIndent))) ||
      (dVar1 != this->topIndent)) || (NAN(dVar1) || NAN(this->topIndent))) {
    this->field_0x300 = this->field_0x300 | 0x20;
    QWidget::update((this->super_QAbstractScrollAreaPrivate).viewport);
    this->field_0x301 = this->field_0x301 | 0x10;
    (this->dirtyBoundingRect).x1 = 0;
    (this->dirtyBoundingRect).y1 = 0;
    (this->dirtyBoundingRect).x2 = -1;
    (this->dirtyBoundingRect).y2 = -1;
    QRegion::QRegion((QRegion *)&local_78);
    pQVar3 = (this->dirtyRegion).d;
    (this->dirtyRegion).d = (QRegionData *)local_78.xp;
    local_78.xp = (qreal)pQVar3;
    QRegion::~QRegion((QRegion *)&local_78);
  }
  else {
    LVar11 = QWidget::layoutDirection(this_00);
    if (((LVar11 == RightToLeft) && (this->leftIndent == 0.0)) && (!NAN(this->leftIndent))) {
      this->field_0x300 = this->field_0x300 | 0x20;
    }
  }
  if (((this->cacheMode).super_QFlagsStorageHelper<QGraphicsView::CacheModeFlag,_4>.
       super_QFlagsStorage<QGraphicsView::CacheModeFlag>.i & 1) != 0) {
    this->field_0x301 = this->field_0x301 | 8;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsViewPrivate::recalculateContentSize()
{
    Q_Q(QGraphicsView);

    const QSize maxSize = q->maximumViewportSize();
    int width = maxSize.width();
    int height = maxSize.height();
    const QRectF viewRect = matrix.mapRect(q->sceneRect());

    bool frameOnlyAround = (q->style()->styleHint(QStyle::SH_ScrollView_FrameOnlyAroundContents, nullptr, q));
    if (frameOnlyAround) {
        if (hbarpolicy == Qt::ScrollBarAlwaysOn)
            height -= frameWidth * 2;
        if (vbarpolicy == Qt::ScrollBarAlwaysOn)
            width -= frameWidth * 2;
    }

    // Adjust the maximum width and height of the viewport based on the width
    // of visible scroll bars.
    const int scrollBarExtent = q->style()->pixelMetric(QStyle::PM_ScrollBarExtent, nullptr, q)
                              + (frameOnlyAround ? frameWidth * 2 : 0);

    // We do not need to subtract the width scrollbars whose policy is
    // Qt::ScrollBarAlwaysOn, this was already done by maximumViewportSize().
    bool useHorizontalScrollBar = (viewRect.width() > width) && hbarpolicy == Qt::ScrollBarAsNeeded;
    bool useVerticalScrollBar = (viewRect.height() > height) && vbarpolicy == Qt::ScrollBarAsNeeded;
    if (useHorizontalScrollBar && vbarpolicy == Qt::ScrollBarAsNeeded) {
        if (viewRect.height() > height - scrollBarExtent)
            useVerticalScrollBar = true;
    }
    if (useVerticalScrollBar && hbarpolicy == Qt::ScrollBarAsNeeded) {
        if (viewRect.width() > width - scrollBarExtent)
            useHorizontalScrollBar = true;
    }
    if (useHorizontalScrollBar)
        height -= scrollBarExtent;
    if (useVerticalScrollBar)
        width -= scrollBarExtent;

    // Setting the ranges of these scroll bars can/will cause the values to
    // change, and scrollContentsBy() will be called correspondingly. This
    // will reset the last center point.
    const QPointF savedLastCenterPoint = lastCenterPoint;

    // Remember the former indent settings
    const qreal oldLeftIndent = leftIndent;
    const qreal oldTopIndent = topIndent;

    // If the whole scene fits horizontally, we center the scene horizontally,
    // and ignore the horizontal scroll bars.
    const int left =  q_round_bound(viewRect.left());
    const int right = q_round_bound(viewRect.right() - width);
    if (left >= right) {
        switch (alignment & Qt::AlignHorizontal_Mask) {
        case Qt::AlignLeft:
            leftIndent = -viewRect.left();
            break;
        case Qt::AlignRight:
            leftIndent = maxSize.width() - viewRect.width() - viewRect.left() - 1;
            break;
        case Qt::AlignHCenter:
        default:
            leftIndent = maxSize.width() / 2 - (viewRect.left() + viewRect.right()) / 2;
            break;
        }

        hbar->setRange(0, 0);
    } else {
        leftIndent = 0;

        hbar->setRange(left, right);
        hbar->setPageStep(width);
        hbar->setSingleStep(width / 20);

        if (oldLeftIndent != 0)
            hbar->setValue(-oldLeftIndent);
    }

    // If the whole scene fits vertically, we center the scene vertically, and
    // ignore the vertical scroll bars.
    const int top = q_round_bound(viewRect.top());
    const int bottom = q_round_bound(viewRect.bottom()  - height);
    if (top >= bottom) {
        switch (alignment & Qt::AlignVertical_Mask) {
        case Qt::AlignTop:
            topIndent = -viewRect.top();
            break;
        case Qt::AlignBottom:
            topIndent = maxSize.height() - viewRect.height() - viewRect.top() - 1;
            break;
        case Qt::AlignVCenter:
        default:
            topIndent = maxSize.height() / 2 - (viewRect.top() + viewRect.bottom()) / 2;
            break;
        }

        vbar->setRange(0, 0);
    } else {
        topIndent = 0;

        vbar->setRange(top, bottom);
        vbar->setPageStep(height);
        vbar->setSingleStep(height / 20);

        if (oldTopIndent != 0)
            vbar->setValue(-oldTopIndent);
    }

    // Restorethe center point from before the ranges changed.
    lastCenterPoint = savedLastCenterPoint;

    // Issue a full update if the indents change.
    // ### If the transform is still the same, we can get away with just a
    // scroll instead.
    if (oldLeftIndent != leftIndent || oldTopIndent != topIndent) {
        dirtyScroll = true;
        updateAll();
    } else if (q->isRightToLeft() && !leftIndent) {
        // In reverse mode, the horizontal scroll always changes after the content
        // size has changed, as the scroll is calculated by summing the min and
        // max values of the range and subtracting the current value. In normal
        // mode the scroll remains unchanged unless the indent has changed.
        dirtyScroll = true;
    }

    if (cacheMode & QGraphicsView::CacheBackground) {
        // Invalidate the background pixmap
        mustResizeBackgroundPixmap = true;
    }
}